

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavScrollToBringItemIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImGuiContext *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  pIVar1 = GImGui;
  fVar7 = (window->InnerMainRect).Min.x + -1.0;
  fVar2 = (window->InnerMainRect).Min.y + -1.0;
  fVar4 = 1.0;
  fVar6 = (window->InnerMainRect).Max.x + 1.0;
  fVar3 = (window->InnerMainRect).Max.y + 1.0;
  fVar5 = (item_rect->Min).x;
  if ((((fVar7 <= fVar5) && (fVar2 <= (item_rect->Min).y)) && ((item_rect->Max).x <= fVar6)) &&
     ((item_rect->Max).y <= fVar3)) {
    return;
  }
  if (fVar7 <= fVar5 || window->ScrollbarX != true) {
    if ((window->ScrollbarX == false) || (fVar5 = (item_rect->Max).x, fVar5 < fVar6))
    goto LAB_0019ef3c;
    fVar5 = (fVar5 - (window->Pos).x) + (window->Scroll).x + (GImGui->Style).ItemSpacing.x;
  }
  else {
    fVar5 = ((fVar5 - (window->Pos).x) + (window->Scroll).x) - (GImGui->Style).ItemSpacing.x;
    fVar4 = 0.0;
  }
  (window->ScrollTarget).x = fVar5;
  (window->ScrollTargetCenterRatio).x = fVar4;
LAB_0019ef3c:
  fVar5 = (item_rect->Min).y;
  if (fVar2 <= fVar5) {
    fVar5 = (item_rect->Max).y;
    if (fVar5 < fVar3) {
      return;
    }
    fVar2 = (fVar5 - (window->Pos).y) + (window->Scroll).y + (pIVar1->Style).ItemSpacing.y;
    fVar5 = 1.0;
  }
  else {
    fVar2 = ((fVar5 - (window->Pos).y) + (window->Scroll).y) - (pIVar1->Style).ItemSpacing.y;
    fVar5 = 0.0;
  }
  (window->ScrollTarget).y = fVar2;
  (window->ScrollTargetCenterRatio).y = fVar5;
  return;
}

Assistant:

static void NavScrollToBringItemIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    // Scroll to keep newly navigated item fully into view
    ImRect window_rect(window->InnerMainRect.Min - ImVec2(1, 1), window->InnerMainRect.Max + ImVec2(1, 1));
    //g.OverlayDrawList.AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]
    if (window_rect.Contains(item_rect))
        return;

    ImGuiContext& g = *GImGui;
    if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
    {
        window->ScrollTarget.x = item_rect.Min.x - window->Pos.x + window->Scroll.x - g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 0.0f;
    }
    else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
    {
        window->ScrollTarget.x = item_rect.Max.x - window->Pos.x + window->Scroll.x + g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 1.0f;
    }
    if (item_rect.Min.y < window_rect.Min.y)
    {
        window->ScrollTarget.y = item_rect.Min.y - window->Pos.y + window->Scroll.y - g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 0.0f;
    }
    else if (item_rect.Max.y >= window_rect.Max.y)
    {
        window->ScrollTarget.y = item_rect.Max.y - window->Pos.y + window->Scroll.y + g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 1.0f;
    }
}